

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_suite.cpp
# Opt level: O0

void value_find_suite::find_map(void)

{
  bool bVar1;
  size_type in_RCX;
  char *pcVar2;
  basic_variable<std::allocator<char>_> *pbVar3;
  bool *pbVar4;
  int *other;
  double *other_00;
  char (*other_01) [6];
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_b68;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_ad8;
  iterator local_ad0;
  basic_variable<std::allocator<char>_> local_ab8;
  undefined1 local_a80 [8];
  iterator where_20;
  basic_variable<std::allocator<char>_> local_a48;
  undefined1 local_a18 [64];
  undefined1 local_9d8 [8];
  iterator where_19;
  basic_variable<std::allocator<char>_> local_9a8;
  undefined1 local_978 [8];
  iterator where_18;
  undefined1 local_948 [8];
  iterator where_17;
  iterator local_928;
  iterator local_910;
  difference_type local_8f8 [2];
  basic_variable<std::allocator<char>_> local_8e8;
  undefined1 local_8b8 [8];
  iterator where_16;
  iterator local_898;
  iterator local_880;
  difference_type local_868 [2];
  undefined1 local_858 [8];
  iterator where_15;
  basic_variable<std::allocator<char>_> local_828;
  undefined1 local_7f0 [8];
  iterator where_14;
  undefined1 local_7c0 [16];
  iterator where_13;
  iterator local_798;
  iterator local_780;
  difference_type local_768 [2];
  basic_variable<std::allocator<char>_> local_758;
  undefined1 local_720 [8];
  iterator where_12;
  iterator local_700;
  iterator local_6e8;
  difference_type local_6d0 [2];
  undefined1 local_6c0 [16];
  iterator where_11;
  basic_variable<std::allocator<char>_> local_688;
  undefined1 local_650 [8];
  iterator where_10;
  undefined1 local_61c [12];
  iterator where_9;
  iterator local_5f8;
  iterator local_5e0;
  difference_type local_5c8 [2];
  basic_variable<std::allocator<char>_> local_5b8;
  undefined1 local_588 [8];
  iterator where_8;
  iterator local_568;
  iterator local_550;
  difference_type local_538;
  undefined1 local_52c [12];
  iterator where_7;
  basic_variable<std::allocator<char>_> local_4f8;
  undefined1 local_4c0 [8];
  iterator where_6;
  undefined1 local_489 [9];
  iterator where_5;
  iterator local_468;
  iterator local_450;
  difference_type local_438 [2];
  basic_variable<std::allocator<char>_> local_428;
  undefined1 local_3f8 [8];
  iterator where_4;
  iterator local_3d8;
  iterator local_3c0;
  difference_type local_3a8;
  undefined1 local_399 [9];
  iterator where_3;
  iterator local_378;
  iterator local_360;
  difference_type local_348 [2];
  basic_variable<std::allocator<char>_> local_338;
  undefined1 local_300 [8];
  iterator where_2;
  iterator local_2e0;
  iterator local_2c8;
  difference_type local_2b0;
  undefined1 local_2a4 [12];
  iterator where_1;
  undefined1 local_270 [8];
  iterator where;
  int local_24c;
  bool local_245 [17];
  nullable local_234;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_230;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_228;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1c8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_168;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_108;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_230 = &local_228;
  local_234 = null;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_trial::dynamic::nullable,_true>
            (local_230,(char (*) [6])"alpha",&local_234);
  local_230 = &local_1c8;
  local_245[0] = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_230,(char (*) [6])"bravo",local_245);
  local_230 = &local_168;
  local_24c = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_int,_true>(local_230,(char (*) [8])"charlie",&local_24c);
  local_230 = &local_108;
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current.current = '\0';
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._9_7_ = 0x40080000000000;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_double,_true>
            (local_230,(char (*) [6])"delta",
             (double *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_230 = &local_a8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[9],_true>
            (local_230,(char (*) [5])"echo",(char (*) [9])"hydrogen");
  local_48._0_8_ = &local_228;
  local_48._8_8_ = 5;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x5;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init);
  local_ad8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_ad8 = local_ad8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_ad8);
  } while (local_ad8 != &local_228);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_270,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_38,&local_228.first);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_270,
                     (iterator *)
                     &where_1.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8ea,"void value_find_suite::find_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_270);
  local_2a4._0_4_ = 0;
  trial::dynamic::value::find<std::allocator<char>,trial::dynamic::nullable>
            ((iterator *)(local_2a4 + 4),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_2a4,(nullable *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2c8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_2e0,(iterator *)(local_2a4 + 4));
  local_2b0 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_2c8,&local_2e0);
  where_2.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x8ef;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8ef,"void value_find_suite::find_map()",&local_2b0,
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_2a4 + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_338);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_300,(value *)local_38,&local_338,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_360,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_378,(iterator *)local_300);
  local_348[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_360,&local_378);
  where_3.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  pbVar4 = (bool *)0x8f3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8f3,"void value_find_suite::find_map()",local_348,
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_378);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_360);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_300);
  local_399[0] = '\x01';
  trial::dynamic::value::find<std::allocator<char>,bool>
            ((iterator *)(local_399 + 1),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_399,pbVar4);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3c0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_3d8,(iterator *)(local_399 + 1));
  local_3a8 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_3c0,&local_3d8);
  where_4.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 1;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x8f8;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8f8,"void value_find_suite::find_map()",&local_3a8,
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_399 + 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_428,true);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_3f8,(value *)local_38,&local_428,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_428);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_450,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_468,(iterator *)local_3f8);
  local_438[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_450,&local_468);
  where_5.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 1;
  pbVar4 = (bool *)0x8fc;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8fc,"void value_find_suite::find_map()",local_438,
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_450);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_3f8);
  local_489[0] = '\0';
  trial::dynamic::value::find<std::allocator<char>,bool>
            ((iterator *)(local_489 + 1),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_489,pbVar4);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)(local_489 + 1),
                     (iterator *)
                     &where_6.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x900,"void value_find_suite::find_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_489 + 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_4f8,false);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_4c0,(value *)local_38,&local_4f8,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_4c0,
                     (iterator *)
                     &where_7.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x904,"void value_find_suite::find_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_4c0);
  local_52c._0_4_ = 2;
  trial::dynamic::value::find<std::allocator<char>,int>
            ((iterator *)(local_52c + 4),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_52c,(int *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_550,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_568,(iterator *)(local_52c + 4));
  local_538 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_550,&local_568);
  where_8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 2;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x909;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x909,"void value_find_suite::find_map()",&local_538,
             &where_8.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_568);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_550);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_52c + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_5b8,2);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_588,(value *)local_38,&local_5b8,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5e0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_5f8,(iterator *)local_588);
  local_5c8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_5e0,&local_5f8);
  where_9.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 2;
  other = (int *)0x90d;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x90d,"void value_find_suite::find_map()",local_5c8,
             &where_9.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_588);
  local_61c._0_4_ = 0x16;
  trial::dynamic::value::find<std::allocator<char>,int>
            ((iterator *)(local_61c + 4),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_61c,other);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_10.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)(local_61c + 4),
                     (iterator *)
                     &where_10.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x911,"void value_find_suite::find_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_10.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_61c + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_688,0x16);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_650,(value *)local_38,&local_688,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_688);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_11.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_650,
                     (iterator *)
                     &where_11.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x915,"void value_find_suite::find_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_11.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_650);
  local_6c0._0_8_ = 0x4008000000000000;
  trial::dynamic::value::find<std::allocator<char>,double>
            ((iterator *)(local_6c0 + 8),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_6c0,(double *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6e8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_700,(iterator *)(local_6c0 + 8));
  local_6d0[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_6e8,&local_700);
  where_12.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 3;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x91a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x91a,"void value_find_suite::find_map()",local_6d0,
             &where_12.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_700);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_6c0 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_758,3.0);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_720,(value *)local_38,&local_758,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_780,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_798,(iterator *)local_720);
  local_768[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_780,&local_798);
  where_13.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 3;
  other_00 = (double *)0x91e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x91e,"void value_find_suite::find_map()",local_768,
             &where_13.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_780);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_720);
  local_7c0._0_8_ = 0x4040800000000000;
  trial::dynamic::value::find<std::allocator<char>,double>
            ((iterator *)(local_7c0 + 8),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_7c0,other_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_14.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)(local_7c0 + 8),
                     (iterator *)
                     &where_14.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x922,"void value_find_suite::find_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_14.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_7c0 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_828,33.0);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_7f0,(value *)local_38,&local_828,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_828);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_15.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_7f0,
                     (iterator *)
                     &where_15.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x926,"void value_find_suite::find_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_15.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_7f0);
  trial::dynamic::value::find<std::allocator<char>,char[9]>
            ((iterator *)local_858,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)"hydrogen",(char (*) [9])pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_880,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_898,(iterator *)local_858);
  local_868[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_880,&local_898);
  where_16.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 4;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x92b;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x92b,"void value_find_suite::find_map()",local_868,
             &where_16.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_898);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_880);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_8e8,"hydrogen");
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_8b8,(value *)local_38,&local_8e8,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_910,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_928,(iterator *)local_8b8);
  local_8f8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_910,&local_928);
  where_17.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 4;
  other_01 = (char (*) [6])0x92f;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x92f,"void value_find_suite::find_map()",local_8f8,
             &where_17.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_928);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_910);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_8b8);
  trial::dynamic::value::find<std::allocator<char>,char[6]>
            ((iterator *)local_948,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)"alpha",other_01);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_18.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_948,
                     (iterator *)
                     &where_18.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x933,"void value_find_suite::find_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_18.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_948);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_9a8,"alpha");
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_978,(value *)local_38,&local_9a8,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_19.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_978,
                     (iterator *)
                     &where_19.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x937,"void value_find_suite::find_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_19.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_978);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a48,"hydrogen");
  local_a18._0_8_ = &local_a48;
  local_a18._8_8_ = 1;
  init_00._M_len = (size_type)pcVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_a18 + 0x10),
             (basic_array<std::allocator<char>_> *)local_a18._0_8_,init_00);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_9d8,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_a18 + 0x10),
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a18 + 0x10));
  local_b68 = (basic_variable<std::allocator<char>_> *)local_a18;
  do {
    local_b68 = local_b68 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_b68);
  } while (local_b68 != &local_a48);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_20.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_9d8,
                     (iterator *)
                     &where_20.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x93c,"void value_find_suite::find_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_20.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_9d8);
  trial::dynamic::basic_map<std::allocator<char>>::make<char_const*,char_const*>
            (&local_ab8,(basic_map<std::allocator<char>> *)"alpha","hydrogen",pcVar2);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_a80,(value *)local_38,&local_ab8,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ab8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_ad0,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_a80,&local_ad0);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x941,"void value_find_suite::find_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ad0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_a80);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void find_map()
{
    variable data = map::make(
        {
            {"alpha", null},
            {"bravo", true},
            {"charlie", 2},
            {"delta", 3.0},
            {"echo", "hydrogen"}
        });
    {
        variable::iterator where = value::find(data, data);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // map - null
    {
        variable::iterator where = value::find(data, null);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        variable::iterator where = value::find(data, variable());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    // map - boolean
    {
        variable::iterator where = value::find(data, true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    }
    {
        variable::iterator where = value::find(data, variable(true));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    }
    {
        variable::iterator where = value::find(data, false);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable(false));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // map - integer
    {
        variable::iterator where = value::find(data, 2);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
    }
    {
        variable::iterator where = value::find(data, variable(2));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
    }
    {
        variable::iterator where = value::find(data, 22);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable(22));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // map - real
    {
        variable::iterator where = value::find(data, 3.0);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 3);
    }
    {
        variable::iterator where = value::find(data, variable(3.0));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 3);
    }
    {
        variable::iterator where = value::find(data, 33.0);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable(33.0));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // map - string
    {
        variable::iterator where = value::find(data, "hydrogen");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 4);
    }
    {
        variable::iterator where = value::find(data, variable("hydrogen"));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 4);
    }
    {
        variable::iterator where = value::find(data, "alpha");
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable("alpha"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // map - array
    {
        variable::iterator where = value::find(data, array::make({"hydrogen"}));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // map - map
    {
        variable::iterator where = value::find(data, map::make("alpha", "hydrogen"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
}